

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_statement(gravity_parser_t *parser)

{
  _Bool _Var1;
  gtoken_t token_00;
  gtoken_t token;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  token_00 = gravity_lexer_peek(parser->lexer->p[parser->lexer->n - 1]);
  _Var1 = token_iserror(token_00);
  if (_Var1) {
    parser_local = (gravity_parser_t *)parse_error(parser);
  }
  else {
    _Var1 = token_islabel_statement(token_00);
    if (_Var1) {
      parser_local = (gravity_parser_t *)parse_label_statement(parser);
    }
    else {
      _Var1 = token_isflow_statement(token_00);
      if (_Var1) {
        parser_local = (gravity_parser_t *)parse_flow_statement(parser);
      }
      else {
        _Var1 = token_isloop_statement(token_00);
        if (_Var1) {
          parser_local = (gravity_parser_t *)parse_loop_statement(parser);
        }
        else {
          _Var1 = token_isjump_statement(token_00);
          if (_Var1) {
            parser_local = (gravity_parser_t *)parse_jump_statement(parser);
          }
          else {
            _Var1 = token_iscompound_statement(token_00);
            if (_Var1) {
              parser_local = (gravity_parser_t *)parse_compound_statement(parser);
            }
            else {
              _Var1 = token_isdeclaration_statement(token_00);
              if (_Var1) {
                parser_local = (gravity_parser_t *)parse_declaration_statement(parser);
              }
              else {
                _Var1 = token_isempty_statement(token_00);
                if (_Var1) {
                  parser_local = (gravity_parser_t *)parse_empty_statement(parser);
                }
                else {
                  _Var1 = token_isimport_statement(token_00);
                  if (_Var1) {
                    parser_local = (gravity_parser_t *)parse_import_statement(parser);
                  }
                  else {
                    _Var1 = token_isspecial_statement(token_00);
                    if (_Var1) {
                      parser_local = (gravity_parser_t *)parse_special_statement(parser);
                    }
                    else {
                      _Var1 = token_ismacro(token_00);
                      if (_Var1) {
                        parser_local = (gravity_parser_t *)parse_macro_statement(parser);
                      }
                      else {
                        parser_local = (gravity_parser_t *)parse_expression_statement(parser);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_statement");

    // label_statement
    // flow_statement
    // loop_statement
    // jump_statement
    // compound_statement
    // declaration_statement
    // empty_statement
    // import_statement
    // expression_statement (default)

    DECLARE_LEXER;
    gtoken_t token = gravity_lexer_peek(lexer);
    if (token_iserror(token)) return parse_error(parser);

    if (token_islabel_statement(token)) return parse_label_statement(parser);
    else if (token_isflow_statement(token)) return parse_flow_statement(parser);
    else if (token_isloop_statement(token)) return parse_loop_statement(parser);
    else if (token_isjump_statement(token)) return parse_jump_statement(parser);
    else if (token_iscompound_statement(token)) return parse_compound_statement(parser);
    else if (token_isdeclaration_statement(token)) return parse_declaration_statement(parser);
    else if (token_isempty_statement(token)) return parse_empty_statement(parser);
    else if (token_isimport_statement(token)) return parse_import_statement(parser);
    else if (token_isspecial_statement(token)) return parse_special_statement(parser);
    else if (token_ismacro(token)) return parse_macro_statement(parser);

    return parse_expression_statement(parser); // DEFAULT
}